

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_stats(REF_INTERP ref_interp)

{
  uint uVar1;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL min_bary;
  REF_DBL max_error;
  REF_DBL this_bary;
  REF_INT node;
  REF_INT extrapolate;
  REF_NODE to_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_INTERP ref_interp_local;
  
  ref_mpi = (REF_MPI)ref_interp->to_grid;
  to_node = (REF_NODE)ref_interp->ref_mpi;
  _node = ((REF_GRID)ref_mpi)->node;
  this_bary._4_4_ = 0;
  to_grid = (REF_GRID)ref_interp;
  if (to_node->max == 0) {
    if (0 < ref_interp->n_tree) {
      printf("tree search: %d found, %.2f avg cells\n",
             (double)ref_interp->tree_cells / (double)ref_interp->n_tree,
             (ulong)(uint)ref_interp->n_tree);
    }
    if ((0 < *(int *)(to_grid->cell + 5)) || (0 < *(int *)((long)to_grid->cell + 0x2c))) {
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             (double)*(int *)(to_grid->cell + 6) / (double)*(int *)(to_grid->cell + 5),
             (ulong)*(uint *)(to_grid->cell + 5),(ulong)*(uint *)((long)to_grid->cell + 0x2c));
    }
    printf("geom nodes: %d failed, %d successful\n",(ulong)*(uint *)(to_grid->cell + 7),
           (ulong)*(uint *)((long)to_grid->cell + 0x34));
  }
  for (this_bary._0_4_ = 0; (int)this_bary._0_4_ < _node->max; this_bary._0_4_ = this_bary._0_4_ + 1
      ) {
    if ((((-1 < (int)this_bary._0_4_) && ((int)this_bary._0_4_ < _node->max)) &&
        (-1 < _node->global[(int)this_bary._0_4_])) &&
       (_node->ref_mpi->id == _node->part[(int)this_bary._0_4_])) {
      if (*(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 1) * 2) <=
          *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ << 2) * 2)) {
        local_68 = *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 1) * 2)
        ;
      }
      else {
        local_68 = *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ << 2) * 2);
      }
      if (*(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 3) * 2) <=
          *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 2) * 2)) {
        local_78 = *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 3) * 2)
        ;
      }
      else {
        local_78 = *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 2) * 2)
        ;
      }
      if (local_78 <= local_68) {
        if (*(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 3) * 2) <=
            *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 2) * 2)) {
          local_90 = *(double *)
                      (&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 3) * 2);
        }
        else {
          local_90 = *(double *)
                      (&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 2) * 2);
        }
        local_88 = local_90;
      }
      else {
        if (*(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 1) * 2) <=
            *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ << 2) * 2)) {
          local_80 = *(double *)
                      (&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ * 4 + 1) * 2);
        }
        else {
          local_80 = *(double *)(&to_grid->cell[0xc]->type + (long)(int)(this_bary._0_4_ << 2) * 2);
        }
        local_88 = local_80;
      }
      max_error = local_88;
      if (local_88 < (double)to_grid->cell[0xd]) {
        this_bary._4_4_ = this_bary._4_4_ + 1;
      }
    }
  }
  this_bary._0_4_ = this_bary._4_4_;
  uVar1 = ref_mpi_sum((REF_MPI)to_node,&this_bary,(void *)((long)&this_bary + 4),1,1);
  if (uVar1 == 0) {
    uVar1 = ref_interp_max_error((REF_INTERP)to_grid,&min_bary);
    if (uVar1 == 0) {
      uVar1 = ref_interp_min_bary((REF_INTERP)to_grid,(REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        if (to_node->max == 0) {
          printf("interp min bary %e max error %e extrap %d\n",_ref_private_macro_code_rss_1,
                 min_bary,(ulong)this_bary._4_4_);
        }
        ref_interp_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x9c8,"ref_interp_stats",(ulong)uVar1,"mb");
        ref_interp_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x9c7,"ref_interp_stats",(ulong)uVar1,"me");
      ref_interp_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x9c5,
           "ref_interp_stats",(ulong)uVar1,"sum");
    ref_interp_local._4_4_ = uVar1;
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_stats(REF_INTERP ref_interp) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT extrapolate = 0;
  REF_INT node;
  REF_DBL this_bary, max_error, min_bary;

  if (ref_mpi_once(ref_mpi)) {
    if (ref_interp->n_tree > 0)
      printf("tree search: %d found, %.2f avg cells\n", ref_interp->n_tree,
             (REF_DBL)ref_interp->tree_cells / (REF_DBL)ref_interp->n_tree);
    if (ref_interp->n_walk > 0 || ref_interp->n_terminated > 0)
      printf("walks: %d successful, %.2f avg cells, %d terminated\n",
             ref_interp->n_walk,
             (REF_DBL)ref_interp->walk_steps / (REF_DBL)ref_interp->n_walk,
             ref_interp->n_terminated);
    printf("geom nodes: %d failed, %d successful\n", ref_interp->n_geom_fail,
           ref_interp->n_geom);
  }

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    this_bary = MIN(
        MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
        MIN(ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]));
    if (this_bary < ref_interp->inside) extrapolate++;
  }
  node = extrapolate;
  RSS(ref_mpi_sum(ref_mpi, &node, &extrapolate, 1, REF_INT_TYPE), "sum");

  RSS(ref_interp_max_error(ref_interp, &max_error), "me");
  RSS(ref_interp_min_bary(ref_interp, &min_bary), "mb");

  if (ref_mpi_once(ref_mpi)) {
    printf("interp min bary %e max error %e extrap %d\n", min_bary, max_error,
           extrapolate);
  }

  return REF_SUCCESS;
}